

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

Error __thiscall
llvm::object::ObjectFile::printSymbolName(ObjectFile *this,raw_ostream *OS,DataRefImpl Symb)

{
  StringRef Str;
  bool bVar1;
  reference ptVar2;
  undefined8 in_RCX;
  Error local_70;
  char *local_68;
  size_t sStack_60;
  undefined4 local_58;
  Expected local_40 [8];
  Expected<llvm::StringRef> Name;
  raw_ostream *OS_local;
  ObjectFile *this_local;
  DataRefImpl Symb_local;
  
  (*OS->_vptr_raw_ostream[8])(local_40,OS,in_RCX);
  bVar1 = llvm::Expected::operator_cast_to_bool(local_40);
  if (bVar1) {
    ptVar2 = Expected<llvm::StringRef>::operator*((Expected<llvm::StringRef> *)local_40);
    local_68 = ptVar2->Data;
    sStack_60 = ptVar2->Length;
    Str.Data = ptVar2->Data;
    Str.Length = ptVar2->Length;
    raw_ostream::operator<<((raw_ostream *)Symb,Str);
    Error::success();
    Error::Error((Error *)this,&local_70);
    ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_70);
  }
  else {
    Expected<llvm::StringRef>::takeError((Expected<llvm::StringRef> *)this);
  }
  local_58 = 1;
  Expected<llvm::StringRef>::~Expected((Expected<llvm::StringRef> *)local_40);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error ObjectFile::printSymbolName(raw_ostream &OS, DataRefImpl Symb) const {
  Expected<StringRef> Name = getSymbolName(Symb);
  if (!Name)
    return Name.takeError();
  OS << *Name;
  return Error::success();
}